

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zeDeviceGetP2PProperties
          (ze_device_handle_t hDevice,ze_device_handle_t hPeerDevice,
          ze_device_p2p_properties_t *pP2PProperties)

{
  ze_pfnDeviceGetP2PProperties_t pfnGetP2PProperties;
  ze_result_t result;
  ze_device_p2p_properties_t *pP2PProperties_local;
  ze_device_handle_t hPeerDevice_local;
  ze_device_handle_t hDevice_local;
  
  pfnGetP2PProperties._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c270 != (code *)0x0) {
    pfnGetP2PProperties._4_4_ = (*DAT_0011c270)(hDevice,hPeerDevice,pP2PProperties);
  }
  return pfnGetP2PProperties._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeDeviceGetP2PProperties(
        ze_device_handle_t hDevice,                     ///< [in] handle of the device performing the access
        ze_device_handle_t hPeerDevice,                 ///< [in] handle of the peer device with the allocation
        ze_device_p2p_properties_t* pP2PProperties      ///< [in,out] Peer-to-Peer properties between source and peer device
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetP2PProperties = context.zeDdiTable.Device.pfnGetP2PProperties;
        if( nullptr != pfnGetP2PProperties )
        {
            result = pfnGetP2PProperties( hDevice, hPeerDevice, pP2PProperties );
        }
        else
        {
            // generic implementation
        }

        return result;
    }